

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickjs.c
# Opt level: O2

int js_create_module_function(JSContext *ctx,JSModuleDef *m)

{
  undefined8 *puVar1;
  byte bVar2;
  JSExportEntry *pJVar3;
  int *piVar4;
  JSValue v;
  int iVar5;
  JSVarRef *pJVar6;
  JSValueUnion JVar7;
  void *pvVar8;
  int iVar9;
  long lVar10;
  long lVar11;
  JSValue v_00;
  
  if (m->field_0x81 == '\0') {
    iVar9 = -1;
    if (m->init_func == (JSModuleInitFunc *)0x0) {
      piVar4 = (int *)(m->func_obj).u.ptr;
      v = m->func_obj;
      v_00 = JS_NewObjectProtoClass(ctx,ctx->function_proto,0xd);
      JVar7 = v_00.u;
      if ((int)v_00.tag == 6) {
        return -1;
      }
      *(int **)((long)JVar7.ptr + 0x30) = piVar4;
      *piVar4 = *piVar4 + 1;
      *(undefined8 *)((long)JVar7.ptr + 0x38) = 0;
      *(undefined8 *)((long)JVar7.ptr + 0x40) = 0;
      if ((long)piVar4[0x17] != 0) {
        pvVar8 = js_mallocz(ctx,(long)piVar4[0x17] << 3);
        if (pvVar8 == (void *)0x0) {
LAB_0013400a:
          JS_FreeValue(ctx,v_00);
          return -1;
        }
        *(void **)((long)JVar7.ptr + 0x38) = pvVar8;
        for (lVar10 = 0; lVar10 < piVar4[0x17]; lVar10 = lVar10 + 1) {
          bVar2 = *(byte *)(*(long *)(piVar4 + 0xe) + lVar10 * 8);
          if ((bVar2 & 1) != 0) {
            pJVar6 = js_create_module_var(ctx,bVar2 >> 3 & 1);
            if (pJVar6 == (JSVarRef *)0x0) goto LAB_0013400a;
            *(JSVarRef **)((long)pvVar8 + lVar10 * 8) = pJVar6;
          }
        }
      }
      m->func_obj = v_00;
      JS_FreeValue(ctx,v);
    }
    else {
      lVar10 = 0x10;
      for (lVar11 = 0; lVar11 < m->export_entries_count; lVar11 = lVar11 + 1) {
        pJVar3 = m->export_entries;
        if (*(int *)((long)&pJVar3->u + lVar10) == 0) {
          pJVar6 = js_create_module_var(ctx,0);
          if (pJVar6 == (JSVarRef *)0x0) {
            return -1;
          }
          *(JSVarRef **)((long)pJVar3 + lVar10 + -8) = pJVar6;
        }
        lVar10 = lVar10 + 0x20;
      }
    }
    m->field_0x81 = 1;
    lVar10 = 8;
    lVar11 = -1;
    do {
      lVar11 = lVar11 + 1;
      if (m->req_module_entries_count <= lVar11) goto LAB_00133ea8;
      puVar1 = (undefined8 *)((long)&m->req_module_entries->module_name + lVar10);
      lVar10 = lVar10 + 0x10;
      iVar5 = js_create_module_function(ctx,(JSModuleDef *)*puVar1);
    } while (-1 < iVar5);
  }
  else {
LAB_00133ea8:
    iVar9 = 0;
  }
  return iVar9;
}

Assistant:

static int js_create_module_function(JSContext *ctx, JSModuleDef *m)
{
    BOOL is_c_module;
    int i;
    JSVarRef *var_ref;
    
    if (m->func_created)
        return 0;

    is_c_module = (m->init_func != NULL);

    if (is_c_module) {
        /* initialize the exported variables */
        for(i = 0; i < m->export_entries_count; i++) {
            JSExportEntry *me = &m->export_entries[i];
            if (me->export_type == JS_EXPORT_TYPE_LOCAL) {
                var_ref = js_create_module_var(ctx, FALSE);
                if (!var_ref)
                    return -1;
                me->u.local.var_ref = var_ref;
            }
        }
    } else {
        if (js_create_module_bytecode_function(ctx, m))
            return -1;
    }
    m->func_created = TRUE;

    /* do it on the dependencies */
    
    for(i = 0; i < m->req_module_entries_count; i++) {
        JSReqModuleEntry *rme = &m->req_module_entries[i];
        if (js_create_module_function(ctx, rme->module) < 0)
            return -1;
    }

    return 0;
}